

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_console.cpp
# Opt level: O3

void crnlib::console::remove_console_output_func(console_output_func pFunc)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  bool bVar3;
  undefined8 uVar4;
  void *pvVar5;
  mutex *this;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  
  init((EVP_PKEY_CTX *)pFunc);
  this = m_pMutex;
  mutex::lock(m_pMutex);
  uVar8 = DAT_001d39d8 - 1;
  uVar7 = DAT_001d39d8;
  if (-1 < (int)uVar8) {
    lVar9 = (ulong)uVar8 * 0x10 + 0x10;
    iVar12 = -DAT_001d39d8;
    uVar11 = (ulong)uVar8;
    uVar8 = DAT_001d39d8;
    do {
      pvVar5 = m_output_funcs;
      uVar10 = (uint)uVar11;
      if ((*(console_output_func *)((long)m_output_funcs + uVar11 * 0x10) == pFunc) &&
         (uVar8 < uVar7 || uVar8 == uVar7)) {
        uVar6 = uVar10;
        if (uVar8 != uVar7) {
          lVar13 = 0;
          do {
            puVar1 = (undefined8 *)((long)pvVar5 + lVar13 + lVar9);
            uVar4 = puVar1[1];
            puVar2 = (undefined8 *)((long)pvVar5 + lVar13 + lVar9 + -0x10);
            *puVar2 = *puVar1;
            puVar2[1] = uVar4;
            lVar13 = lVar13 + 0x10;
          } while ((ulong)(uVar7 + iVar12) << 4 != lVar13);
          uVar6 = DAT_001d39d8 - 1;
        }
        uVar7 = uVar6;
        _DAT_001d39d8 = CONCAT44(DAT_001d39dc,uVar7);
      }
      lVar9 = lVar9 + -0x10;
      iVar12 = iVar12 + 1;
      bVar3 = 0 < (long)uVar11;
      uVar11 = uVar11 - 1;
      uVar8 = uVar10;
    } while (bVar3);
  }
  if ((uVar7 == 0) && (m_output_funcs != (void *)0x0)) {
    crnlib_free(m_output_funcs);
    m_output_funcs = (void *)0x0;
    _DAT_001d39d8 = 0;
  }
  mutex::unlock(this);
  return;
}

Assistant:

void console::remove_console_output_func(console_output_func pFunc)
    {
        init();

        scoped_mutex lock(*m_pMutex);

        for (int i = m_output_funcs.size() - 1; i >= 0; i--)
        {
            if (m_output_funcs[i].m_func == pFunc)
            {
                m_output_funcs.erase(m_output_funcs.begin() + i);
            }
        }

        if (!m_output_funcs.size())
        {
            m_output_funcs.clear();
        }
    }